

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

int SSL_ECH_KEYS_has_duplicate_config_id(SSL_ECH_KEYS *keys)

{
  byte bVar1;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *puVar2;
  long lVar3;
  long lVar4;
  bool seen [256];
  char acStack_118 [264];
  
  lVar4 = 0;
  memset(acStack_118,0,0x100);
  puVar2 = (keys->configs).data_;
  lVar3 = (keys->configs).size_ << 3;
  while ((lVar3 != lVar4 &&
         (bVar1 = *(byte *)(*(long *)((long)&(puVar2->_M_t).
                                             super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>.
                                             _M_head_impl + lVar4) + 0x43),
         acStack_118[bVar1] == '\0'))) {
    acStack_118[bVar1] = '\x01';
    lVar4 = lVar4 + 8;
  }
  return (int)(lVar3 != lVar4);
}

Assistant:

int SSL_ECH_KEYS_has_duplicate_config_id(const SSL_ECH_KEYS *keys) {
  bool seen[256] = {false};
  for (const auto &config : keys->configs) {
    if (seen[config->ech_config().config_id]) {
      return 1;
    }
    seen[config->ech_config().config_id] = true;
  }
  return 0;
}